

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg.h
# Opt level: O2

string * svg::attribute<double>
                   (string *__return_storage_ptr__,string *attribute_name,double *value,string *unit
                   )

{
  ostream *poVar1;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,(string *)attribute_name);
  std::operator<<(poVar1,"=\"");
  poVar1 = std::ostream::_M_insert<double>(*value);
  poVar1 = std::operator<<(poVar1,(string *)unit);
  std::operator<<(poVar1,"\" ");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string attribute(std::string const & attribute_name,
        T const & value, std::string const & unit = "")
    {
        std::stringstream ss;
        ss << attribute_name << "=\"" << value << unit << "\" ";
        return ss.str();
    }